

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

void google::protobuf::Type::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  _func_int **pp_Var4;
  Nonnull<const_char_*> pcVar5;
  undefined8 extraout_RAX;
  Arena *pAVar6;
  Arena *extraout_RDX;
  string *psVar7;
  MessageLite *this;
  pointer unaff_R12;
  Arena *arena;
  _Alloc_hider local_48;
  undefined8 local_38;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar5 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar5 != (Nonnull<const_char_*>)0x0) {
    MergeImpl();
    if (local_48._M_p != unaff_R12) {
      operator_delete(local_48._M_p,local_38 + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
    protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_,
               Arena::CopyConstruct<google::protobuf::Field>);
  }
  if ((int)from_msg[3]._internal_metadata_.ptr_ != 0) {
    protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)(to_msg + 3),(RepeatedPtrFieldBase *)(from_msg + 3));
  }
  if (*(int *)&from_msg[5]._vptr_MessageLite != 0) {
    protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)&to_msg[4]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[4]._internal_metadata_,
               Arena::CopyConstruct<google::protobuf::Option>);
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) == 0) goto LAB_00ef3648;
    psVar7 = (string *)((ulong)from_msg[6]._vptr_MessageLite & 0xfffffffffffffffc);
    if (((InternalMetadata *)&psVar7->_M_string_length)->ptr_ == 0) {
      if (((ulong)to_msg[6]._vptr_MessageLite & 3) != 0) goto LAB_00ef3648;
      local_48._M_p = (pointer)&stack0xffffffffffffffc8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffffb8,anon_var_dwarf_a12c75 + 5);
      *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
      pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      protobuf::internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)(to_msg + 6),(string *)&stack0xffffffffffffffb8,pAVar6);
      if (local_48._M_p == (pointer)&stack0xffffffffffffffc8) goto LAB_00ef3648;
      operator_delete(local_48._M_p,local_38 + 1);
      goto LAB_00ef3648;
    }
    *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
    this = to_msg + 6;
    pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar6 & 1) != 0) goto LAB_00ef3767;
    while( true ) {
      protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)this,psVar7,pAVar6);
LAB_00ef3648:
      if ((uVar1 & 2) != 0) {
        psVar7 = (string *)(from_msg[6]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
        if (psVar7->_M_string_length == 0) {
          if ((to_msg[6]._internal_metadata_.ptr_ & 3) == 0) {
            local_48._M_p = (pointer)&stack0xffffffffffffffc8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xffffffffffffffb8,anon_var_dwarf_a12c75 + 5);
            *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 2;
            pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
            if (((ulong)pAVar6 & 1) != 0) {
              pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
            }
            protobuf::internal::ArenaStringPtr::Set<>
                      ((ArenaStringPtr *)&to_msg[6]._internal_metadata_,
                       (string *)&stack0xffffffffffffffb8,pAVar6);
            if (local_48._M_p != (pointer)&stack0xffffffffffffffc8) {
              operator_delete(local_48._M_p,local_38 + 1);
            }
          }
        }
        else {
          *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 2;
          pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar6 & 1) != 0) {
            pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
          }
          protobuf::internal::ArenaStringPtr::Set<>
                    ((ArenaStringPtr *)&to_msg[6]._internal_metadata_,psVar7,pAVar6);
        }
      }
      if ((uVar1 & 4) == 0) goto LAB_00ef36fd;
      psVar7 = (string *)from_msg[7]._vptr_MessageLite;
      if (psVar7 != (string *)0x0) break;
      this = (MessageLite *)&stack0xffffffffffffffb8;
      MergeImpl((Type *)&stack0xffffffffffffffb8);
      pAVar6 = extraout_RDX;
LAB_00ef3767:
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    if ((MessageLite *)to_msg[7]._vptr_MessageLite == (MessageLite *)0x0) {
      pp_Var4 = (_func_int **)Arena::CopyConstruct<google::protobuf::SourceContext>(arena,psVar7);
      to_msg[7]._vptr_MessageLite = pp_Var4;
    }
    else {
      SourceContext::MergeImpl((MessageLite *)to_msg[7]._vptr_MessageLite,(MessageLite *)psVar7);
    }
LAB_00ef36fd:
    if (((uVar1 & 8) != 0) && (iVar2 = (int)from_msg[7]._internal_metadata_.ptr_, iVar2 != 0)) {
      *(int *)&to_msg[7]._internal_metadata_.ptr_ = iVar2;
    }
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  uVar3 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar3 & 1) != 0) {
    protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8));
  }
  return;
}

Assistant:

void Type::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Type*>(&to_msg);
  auto& from = static_cast<const Type&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Type)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_fields()->MergeFrom(
      from._internal_fields());
  _this->_internal_mutable_oneofs()->MergeFrom(from._internal_oneofs());
  _this->_internal_mutable_options()->MergeFrom(
      from._internal_options());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_name().empty()) {
        _this->_internal_set_name(from._internal_name());
      } else {
        if (_this->_impl_.name_.IsDefault()) {
          _this->_internal_set_name("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!from._internal_edition().empty()) {
        _this->_internal_set_edition(from._internal_edition());
      } else {
        if (_this->_impl_.edition_.IsDefault()) {
          _this->_internal_set_edition("");
        }
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.source_context_ != nullptr);
      if (_this->_impl_.source_context_ == nullptr) {
        _this->_impl_.source_context_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.source_context_);
      } else {
        _this->_impl_.source_context_->MergeFrom(*from._impl_.source_context_);
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_syntax() != 0) {
        _this->_impl_.syntax_ = from._impl_.syntax_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}